

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_4447fb::Db::parseUnresolvedName(Db *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  Db *pDVar4;
  Node *local_88;
  Node *Base;
  Node *TA_1;
  Node *Qual_1;
  StringView local_60;
  byte local_49;
  Node *pNStack_48;
  bool Global;
  Node *Base_1;
  Node *Qual;
  Node *TA;
  Db *local_20;
  Node *SoFar;
  Db *this_local;
  
  local_20 = (Db *)0x0;
  SoFar = (Node *)this;
  StringView::StringView((StringView *)&TA,"srN");
  bVar1 = consumeIf(this,_TA);
  if (bVar1) {
    local_20 = (Db *)parseUnresolvedType(this);
    if (local_20 == (Db *)0x0) {
      this_local = (Db *)0x0;
    }
    else {
      cVar2 = look(this,0);
      if (cVar2 == 'I') {
        Qual = parseTemplateArgs(this,false);
        if (Qual == (Node *)0x0) {
          return (Node *)0x0;
        }
        local_20 = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::NameWithTemplateArgs,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                                   ((Db *)this,(Node **)&local_20,&Qual);
      }
      while (bVar1 = consumeIf(this,'E'), ((bVar1 ^ 0xffU) & 1) != 0) {
        Base_1 = parseSimpleId(this);
        if (Base_1 == (Node *)0x0) {
          return (Node *)0x0;
        }
        local_20 = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::QualifiedName,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                                   ((Db *)this,(Node **)&local_20,&Base_1);
      }
      pNStack_48 = parseBaseUnresolvedName(this);
      if (pNStack_48 == (Node *)0x0) {
        this_local = (Db *)0x0;
      }
      else {
        this_local = (Db *)(anonymous_namespace)::Db::
                           make<(anonymous_namespace)::QualifiedName,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                                     ((Db *)this,(Node **)&local_20,&stack0xffffffffffffffb8);
      }
    }
  }
  else {
    StringView::StringView(&local_60,"gs");
    local_49 = consumeIf(this,local_60);
    StringView::StringView((StringView *)&Qual_1,"sr");
    bVar1 = consumeIf(this,_Qual_1);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      cVar2 = look(this,0);
      iVar3 = isdigit((int)cVar2);
      if (iVar3 == 0) {
        local_20 = (Db *)parseUnresolvedType(this);
        if (local_20 == (Db *)0x0) {
          return (Node *)0x0;
        }
        cVar2 = look(this,0);
        if (cVar2 == 'I') {
          Base = parseTemplateArgs(this,false);
          if (Base == (Node *)0x0) {
            return (Node *)0x0;
          }
          local_20 = (Db *)(anonymous_namespace)::Db::
                           make<(anonymous_namespace)::NameWithTemplateArgs,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                                     ((Db *)this,(Node **)&local_20,&Base);
        }
      }
      else {
        do {
          TA_1 = parseSimpleId(this);
          if ((Db *)TA_1 == (Db *)0x0) {
            return (Node *)0x0;
          }
          if (local_20 == (Db *)0x0) {
            pDVar4 = (Db *)TA_1;
            if ((local_49 & 1) != 0) {
              pDVar4 = (Db *)(anonymous_namespace)::Db::
                             make<(anonymous_namespace)::GlobalQualifiedName,(anonymous_namespace)::Node*&>
                                       ((Db *)this,&TA_1);
            }
          }
          else {
            pDVar4 = (Db *)(anonymous_namespace)::Db::
                           make<(anonymous_namespace)::QualifiedName,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                                     ((Db *)this,(Node **)&local_20,&TA_1);
          }
          local_20 = pDVar4;
          bVar1 = consumeIf(this,'E');
        } while (((bVar1 ^ 0xffU) & 1) != 0);
      }
      if (local_20 == (Db *)0x0) {
        __assert_fail("SoFar != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                      ,0xb5b,"Node *(anonymous namespace)::Db::parseUnresolvedName()");
      }
      local_88 = parseBaseUnresolvedName(this);
      if (local_88 == (Node *)0x0) {
        this_local = (Db *)0x0;
      }
      else {
        this_local = (Db *)(anonymous_namespace)::Db::
                           make<(anonymous_namespace)::QualifiedName,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                                     ((Db *)this,(Node **)&local_20,&local_88);
      }
    }
    else {
      local_20 = (Db *)parseBaseUnresolvedName(this);
      if (local_20 == (Db *)0x0) {
        this_local = (Db *)0x0;
      }
      else {
        if ((local_49 & 1) != 0) {
          local_20 = (Db *)(anonymous_namespace)::Db::
                           make<(anonymous_namespace)::GlobalQualifiedName,(anonymous_namespace)::Node*&>
                                     ((Db *)this,(Node **)&local_20);
        }
        this_local = local_20;
      }
    }
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseUnresolvedName() {
  Node *SoFar = nullptr;

  // srN <unresolved-type> [<template-args>] <unresolved-qualifier-level>* E <base-unresolved-name>
  // srN <unresolved-type>                   <unresolved-qualifier-level>+ E <base-unresolved-name>
  if (consumeIf("srN")) {
    SoFar = parseUnresolvedType();
    if (SoFar == nullptr)
      return nullptr;

    if (look() == 'I') {
      Node *TA = parseTemplateArgs();
      if (TA == nullptr)
        return nullptr;
      SoFar = make<NameWithTemplateArgs>(SoFar, TA);
    }

    while (!consumeIf('E')) {
      Node *Qual = parseSimpleId();
      if (Qual == nullptr)
        return nullptr;
      SoFar = make<QualifiedName>(SoFar, Qual);
    }

    Node *Base = parseBaseUnresolvedName();
    if (Base == nullptr)
      return nullptr;
    return make<QualifiedName>(SoFar, Base);
  }

  bool Global = consumeIf("gs");

  // [gs] <base-unresolved-name>                     # x or (with "gs") ::x
  if (!consumeIf("sr")) {
    SoFar = parseBaseUnresolvedName();
    if (SoFar == nullptr)
      return nullptr;
    if (Global)
      SoFar = make<GlobalQualifiedName>(SoFar);
    return SoFar;
  }

  // [gs] sr <unresolved-qualifier-level>+ E   <base-unresolved-name>
  if (std::isdigit(look())) {
    do {
      Node *Qual = parseSimpleId();
      if (Qual == nullptr)
        return nullptr;
      if (SoFar)
        SoFar = make<QualifiedName>(SoFar, Qual);
      else if (Global)
        SoFar = make<GlobalQualifiedName>(Qual);
      else
        SoFar = Qual;
    } while (!consumeIf('E'));
  }
  //      sr <unresolved-type>                 <base-unresolved-name>
  //      sr <unresolved-type> <template-args> <base-unresolved-name>
  else {
    SoFar = parseUnresolvedType();
    if (SoFar == nullptr)
      return nullptr;

    if (look() == 'I') {
      Node *TA = parseTemplateArgs();
      if (TA == nullptr)
        return nullptr;
      SoFar = make<NameWithTemplateArgs>(SoFar, TA);
    }
  }

  assert(SoFar != nullptr);

  Node *Base = parseBaseUnresolvedName();
  if (Base == nullptr)
    return nullptr;
  return make<QualifiedName>(SoFar, Base);
}